

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall
wabt::SharedValidator::OnGlobalInitExpr_RefFunc(SharedValidator *this,Location *loc,Var *func_var)

{
  Result RVar1;
  Result RVar2;
  Var local_70;
  
  Var::Var(&local_70,func_var);
  RVar1 = CheckFuncIndex(this,&local_70,(FuncType *)0x0);
  Var::~Var(&local_70);
  std::vector<wabt::Var,_std::allocator<wabt::Var>_>::push_back(&this->init_expr_funcs_,func_var);
  RVar2 = CheckType(this,loc,(Type)0xfffffff0,
                    (Type)(this->globals_).
                          super__Vector_base<wabt::SharedValidator::GlobalType,_std::allocator<wabt::SharedValidator::GlobalType>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1].type.enum_,
                    "global initializer expression");
  RVar1.enum_._0_1_ = RVar2.enum_ == Error || RVar1.enum_ == Error;
  RVar1.enum_._1_3_ = 0;
  return (Result)RVar1.enum_;
}

Assistant:

Result SharedValidator::OnGlobalInitExpr_RefFunc(const Location& loc,
                                                 Var func_var) {
  Result result = Result::Ok;
  result |= CheckFuncIndex(func_var);
  init_expr_funcs_.push_back(func_var);
  result |= CheckType(loc, Type::FuncRef, globals_.back().type,
                      "global initializer expression");
  return result;
}